

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O0

LY_ERR lydxml_subtree_r(lyd_xml_ctx *lydctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  uint uVar1;
  undefined8 uVar2;
  lyd_node *lydctx_00;
  int iVar3;
  ly_err_item *plVar4;
  bool bVar5;
  lyd_node *local_100;
  __pthread_internal_list *local_f0;
  ly_err_item *__eitem_2;
  ly_err_item *__eitem_1;
  ly_err_item *__eitem;
  lyd_node *plStack_98;
  ly_bool parse_subtree;
  lyd_node *insert_anchor;
  lyd_node *node;
  lysc_ext_instance *plStack_80;
  uint32_t orig_parse_opts;
  lysc_ext_instance *ext;
  lysc_node *snode;
  lyd_attr *attr;
  lyd_meta *meta;
  ly_ctx *ctx;
  lyxml_ctx *xmlctx;
  size_t name_len;
  size_t prefix_len;
  char *name;
  char *prefix;
  LY_ERR rc;
  LY_ERR r;
  ly_set *parsed_local;
  lyd_node **first_p_local;
  lyd_node *parent_local;
  lyd_xml_ctx *lydctx_local;
  
  prefix._0_4_ = 0;
  attr = (lyd_attr *)0x0;
  snode = (lysc_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  plStack_80 = (lysc_ext_instance *)0x0;
  insert_anchor = (lyd_node *)0x0;
  plStack_98 = (lyd_node *)0x0;
  _rc = parsed;
  parsed_local = (ly_set *)first_p;
  first_p_local = (lyd_node **)parent;
  parent_local = (lyd_node *)lydctx;
  if ((parent == (lyd_node *)0x0) && (first_p == (lyd_node **)0x0)) {
    __assert_fail("parent || first_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x3f2,
                  "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  ctx = (ly_ctx *)lydctx->xmlctx;
  meta = (lyd_meta *)(ctx->dict).hash_tab;
  uVar1 = lydctx->parse_opts;
  lydctx->parse_opts = lydctx->parse_opts & 0xffbfffff;
  node._4_4_ = lydctx->parse_opts;
  if ((ctx->dict).lock.__data.__owner != LYXML_ELEMENT) {
    __assert_fail("xmlctx->status == LYXML_ELEMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x3fc,
                  "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  name = ((anon_union_8_2_192256a2_for_lyxml_ctx_3 *)((long)&(ctx->dict).lock + 0x10))->prefix;
  name_len = ((anon_union_8_2_4da628e2_for_lyxml_ctx_5 *)&(ctx->dict).lock.__data.__list)->
             prefix_len;
  prefix_len = *(size_t *)
                ((anon_union_8_2_4da628e2_for_lyxml_ctx_5 *)&(ctx->dict).lock.__data.__list + 1);
  xmlctx = *(lyxml_ctx **)&ctx->search_paths;
  prefix._0_4_ = lyxml_ctx_next((lyxml_ctx *)ctx);
  if ((LY_ERR)prefix != LY_SUCCESS) goto LAB_00148931;
  if ((((((ulong)parent_local->parent & 0x80) == 0) || (first_p_local != (lyd_node **)0x0)) ||
      (xmlctx == (lyxml_ctx *)0x0)) ||
     ((name_len != 0 ||
      (iVar3 = ly_strncmp("eventTime",(char *)prefix_len,(size_t)xmlctx), iVar3 != 0)))) {
    prefix._4_4_ = lydxml_subtree_get_snode
                             ((lyd_xml_ctx *)parent_local,(lyd_node *)first_p_local,name,name_len,
                              (char *)prefix_len,(size_t)xmlctx,(lysc_node **)&ext,
                              &stack0xffffffffffffff80);
    if (prefix._4_4_ != LY_SUCCESS) {
      prefix._0_4_ = prefix._4_4_;
      if (((prefix._4_4_ == LY_EVALID) && (((ulong)parent_local->schema & 0x400000000) != 0)) &&
         (prefix._4_4_ = lydxml_data_skip((lyxml_ctx *)ctx), prefix._4_4_ != LY_SUCCESS)) {
        prefix._0_4_ = prefix._4_4_;
      }
      goto LAB_00148931;
    }
    if ((ext == (lysc_ext_instance *)0x0) && (((ulong)parent_local->schema & 0x40000) == 0)) {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Skipping parsing of unknown node \"%.*s\".",
             (ulong)xmlctx & 0xffffffff,prefix_len);
      prefix._0_4_ = lydxml_data_skip((lyxml_ctx *)ctx);
      goto LAB_00148931;
    }
    if ((ctx->dict).lock.__data.__owner == 3) {
      if (ext == (lysc_ext_instance *)0x0) {
        if (((ulong)parent_local->schema & 0x40000) == 0) {
          __assert_fail("lydctx->parse_opts & LYD_PARSE_OPAQ",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                        ,0x43a,
                        "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                       );
        }
        prefix._4_4_ = lydxml_attrs((lyxml_ctx *)ctx,(lyd_attr **)&snode);
      }
      else {
        prefix._4_4_ = lydxml_metadata((lyd_xml_ctx *)parent_local,(lysc_node *)ext,
                                       (lyd_meta **)&attr);
      }
    }
    if (prefix._4_4_ != LY_SUCCESS) {
      prefix._0_4_ = prefix._4_4_;
      plVar4 = ly_err_last(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0);
      if ((((prefix._4_4_ != LY_EVALID) || (parent_local == (lyd_node *)0x0)) ||
          (((ulong)parent_local->schema & 0x400000000) == 0)) || (plVar4->vecode == LYVE_SYNTAX))
      goto LAB_00148931;
    }
    lydctx_00 = parent_local;
    if ((ctx->dict).lock.__data.__owner != 2) {
      __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                    ,0x440,
                    "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                   );
    }
    if (ext == (lysc_ext_instance *)0x0) {
      if (first_p_local == (lyd_node **)0x0) {
        local_100 = *(lyd_node **)parsed_local;
      }
      else {
        local_100 = lyd_child((lyd_node *)first_p_local);
      }
      prefix._4_4_ = lydxml_subtree_opaq((lyd_xml_ctx *)lydctx_00,local_100,name,(uint32_t)name_len,
                                         (char *)prefix_len,(uint32_t)xmlctx,
                                         &stack0xffffffffffffff68,&insert_anchor);
    }
    else if (((ulong)ext->def & 0xc) == 0) {
      if (((ulong)ext->def & 0x711) == 0) {
        if (((ulong)ext->def & 0x60) == 0) {
          __assert_fail("snode->nodetype & LYD_NODE_ANY",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                        ,0x44d,
                        "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                       );
        }
        prefix._4_4_ = lydxml_subtree_any((lyd_xml_ctx *)parent_local,(lysc_node *)ext,plStack_80,
                                          &insert_anchor);
      }
      else {
        prefix._4_4_ = lydxml_subtree_inner
                                 ((lyd_xml_ctx *)parent_local,(lysc_node *)ext,plStack_80,
                                  &insert_anchor);
      }
    }
    else {
      prefix._4_4_ = lydxml_subtree_term((lyd_xml_ctx *)parent_local,(lyd_node *)first_p_local,
                                         (lysc_node *)ext,&insert_anchor);
    }
    if (prefix._4_4_ != LY_SUCCESS) {
      prefix._0_4_ = prefix._4_4_;
      plVar4 = ly_err_last(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0);
      if (((prefix._4_4_ != LY_EVALID) || (parent_local == (lyd_node *)0x0)) ||
         ((((ulong)parent_local->schema & 0x400000000) == 0 || (plVar4->vecode == LYVE_SYNTAX))))
      goto LAB_00148931;
    }
  }
  else {
    if ((ctx->dict).lock.__data.__owner != 2) {
      __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                    ,0x40b,
                    "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                   );
    }
    if ((ctx->dict).lock.__size[0x20] == '\0') {
      local_f0 = (ctx->dict).lock.__data.__list.__prev;
    }
    else {
      local_f0 = (__pthread_internal_list *)0x0;
    }
    prefix._0_4_ = lyd_create_opaq((ly_ctx *)(ctx->dict).hash_tab,(char *)prefix_len,(size_t)xmlctx,
                                   name,name_len,"urn:ietf:params:xml:ns:netconf:notification:1.0",
                                   0x2f,*(char **)((long)&(ctx->dict).lock + 0x10),(size_t)local_f0,
                                   (ly_bool *)0x0,LY_VALUE_XML,(void *)0x0,0x3f3,&insert_anchor);
    if ((LY_ERR)prefix != LY_SUCCESS) goto LAB_00148931;
    prefix._4_4_ = lyd_parser_notif_eventtime_validate(insert_anchor);
    if (prefix._4_4_ != LY_SUCCESS) {
      prefix._0_4_ = prefix._4_4_;
      lyd_free_tree(insert_anchor);
      goto LAB_00148931;
    }
    prefix._4_4_ = lyxml_ctx_next((lyxml_ctx *)ctx);
    if (prefix._4_4_ != LY_SUCCESS) {
      prefix._0_4_ = prefix._4_4_;
      lyd_free_tree(insert_anchor);
      goto LAB_00148931;
    }
    if ((ctx->dict).lock.__data.__owner != 1) {
      ly_vlog((ly_ctx *)meta,(char *)0x0,LYVE_DATA,
              "Unexpected notification \"eventTime\" node children.");
      prefix._0_4_ = LY_EVALID;
      lyd_free_tree(insert_anchor);
      goto LAB_00148931;
    }
  }
  if ((insert_anchor != (lyd_node *)0x0) && (ext != (lysc_ext_instance *)0x0)) {
    prefix._4_4_ = lyd_parser_set_data_flags
                             (insert_anchor,(lyd_meta **)&attr,(lyd_ctx *)parent_local,plStack_80);
    if (prefix._4_4_ != LY_SUCCESS) {
      prefix._0_4_ = prefix._4_4_;
      lyd_free_tree(insert_anchor);
      goto LAB_00148931;
    }
    if (((((ulong)parent_local->schema & 0x10000) == 0) &&
        (prefix._4_4_ = lyd_validate_node_ext(insert_anchor,(ly_set *)&parent_local[0x4a].schema),
        prefix._4_4_ != LY_SUCCESS)) &&
       ((prefix._0_4_ = prefix._4_4_,
        plVar4 = ly_err_last(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0),
        prefix._4_4_ != LY_EVALID ||
        (((parent_local == (lyd_node *)0x0 || (((ulong)parent_local->schema & 0x400000000) == 0)) ||
         (plVar4->vecode == LYVE_SYNTAX)))))) goto LAB_00148931;
  }
  if ((ctx->dict).lock.__data.__owner != 1) {
    __assert_fail("xmlctx->status == LYXML_ELEM_CLOSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x460,
                  "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  if (((uVar1 & 0x400000) == 0) &&
     (prefix._4_4_ = lyxml_ctx_next((lyxml_ctx *)ctx), prefix._4_4_ != LY_SUCCESS)) {
    prefix._0_4_ = prefix._4_4_;
    lyd_free_tree(insert_anchor);
  }
  else if (insert_anchor != (lyd_node *)0x0) {
    if (ext == (lysc_ext_instance *)0x0) {
      lyd_insert_attr(insert_anchor,(lyd_attr *)snode);
      snode = (lysc_node *)0x0;
    }
    else {
      lyd_insert_meta(insert_anchor,(lyd_meta *)attr,'\0');
      attr = (lyd_attr *)0x0;
    }
    if (plStack_98 == (lyd_node *)0x0) {
      if (plStack_80 == (lysc_ext_instance *)0x0) {
        lyd_insert_node((lyd_node *)first_p_local,(lyd_node **)parsed_local,insert_anchor,
                        (uint)(((ulong)parent_local->schema & 0x200000) != 0));
      }
      else {
        prefix._4_4_ = lyplg_ext_insert((lyd_node *)first_p_local,insert_anchor);
        if (prefix._4_4_ != LY_SUCCESS) {
          prefix._0_4_ = prefix._4_4_;
          lyd_free_tree(insert_anchor);
          goto LAB_00148931;
        }
      }
    }
    else {
      lyd_insert_after(plStack_98,insert_anchor);
    }
    while( true ) {
      bVar5 = false;
      if (first_p_local == (lyd_node **)0x0) {
        bVar5 = *(long *)(*(long *)(*(long *)parsed_local + 0x20) + 0x18) != 0;
      }
      if (!bVar5) break;
      uVar2 = *(undefined8 *)(*(long *)parsed_local + 0x20);
      parsed_local->size = (int)uVar2;
      parsed_local->count = (int)((ulong)uVar2 >> 0x20);
    }
    if (_rc != (ly_set *)0x0) {
      ly_set_add(_rc,insert_anchor,'\x01',(uint32_t *)0x0);
    }
  }
LAB_00148931:
  *(uint32_t *)&parent_local->schema = node._4_4_;
  lyd_free_meta_siblings((lyd_meta *)attr);
  lyd_free_attr_siblings((ly_ctx *)meta,(lyd_attr *)snode);
  return (LY_ERR)prefix;
}

Assistant:

static LY_ERR
lydxml_subtree_r(struct lyd_xml_ctx *lydctx, struct lyd_node *parent, struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR r, rc = LY_SUCCESS;
    const char *prefix, *name;
    size_t prefix_len, name_len;
    struct lyxml_ctx *xmlctx;
    const struct ly_ctx *ctx;
    struct lyd_meta *meta = NULL;
    struct lyd_attr *attr = NULL;
    const struct lysc_node *snode = NULL;
    struct lysc_ext_instance *ext = NULL;
    uint32_t orig_parse_opts;
    struct lyd_node *node = NULL, *insert_anchor = NULL;
    ly_bool parse_subtree;

    assert(parent || first_p);

    xmlctx = lydctx->xmlctx;
    ctx = xmlctx->ctx;

    parse_subtree = lydctx->parse_opts & LYD_PARSE_SUBTREE ? 1 : 0;
    /* all descendants should be parsed */
    lydctx->parse_opts &= ~LYD_PARSE_SUBTREE;
    orig_parse_opts = lydctx->parse_opts;

    assert(xmlctx->status == LYXML_ELEMENT);

    /* remember element prefix and name */
    prefix = xmlctx->prefix;
    prefix_len = xmlctx->prefix_len;
    name = xmlctx->name;
    name_len = xmlctx->name_len;

    /* parser next */
    rc = lyxml_ctx_next(xmlctx);
    LY_CHECK_GOTO(rc, cleanup);

    if ((lydctx->int_opts & LYD_INTOPT_EVENTTIME) && !parent && name_len && !prefix_len &&
            !ly_strncmp("eventTime", name, name_len)) {
        /* parse eventTime, create node */
        assert(xmlctx->status == LYXML_ELEM_CONTENT);
        rc = lyd_create_opaq(xmlctx->ctx, name, name_len, prefix, prefix_len,
                "urn:ietf:params:xml:ns:netconf:notification:1.0", 47, xmlctx->value,
                xmlctx->ws_only ? 0 : xmlctx->value_len, NULL, LY_VALUE_XML, NULL, LYD_HINT_DATA, &node);
        LY_CHECK_GOTO(rc, cleanup);

        /* validate the value */
        r = lyd_parser_notif_eventtime_validate(node);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);

        /* parser next */
        r = lyxml_ctx_next(xmlctx);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
        if (xmlctx->status != LYXML_ELEM_CLOSE) {
            LOGVAL(ctx, LYVE_DATA, "Unexpected notification \"eventTime\" node children.");
            rc = LY_EVALID;
            lyd_free_tree(node);
            goto cleanup;
        }

        goto node_parsed;
    }

    /* get the schema node */
    r = lydxml_subtree_get_snode(lydctx, parent, prefix, prefix_len, name, name_len, &snode, &ext);
    if (r) {
        rc = r;
        if ((r == LY_EVALID) && (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR)) {
            /* skip the invalid data */
            if ((r = lydxml_data_skip(xmlctx))) {
                rc = r;
            }
        }
        goto cleanup;
    } else if (!snode && !(lydctx->parse_opts & LYD_PARSE_OPAQ)) {
        LOGVRB("Skipping parsing of unknown node \"%.*s\".", (int)name_len, name);

        /* skip element with children */
        rc = lydxml_data_skip(xmlctx);
        goto cleanup;
    }

    /* create metadata/attributes */
    if (xmlctx->status == LYXML_ATTRIBUTE) {
        if (snode) {
            r = lydxml_metadata(lydctx, snode, &meta);
        } else {
            assert(lydctx->parse_opts & LYD_PARSE_OPAQ);
            r = lydxml_attrs(xmlctx, &attr);
        }
    }
    LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

    assert(xmlctx->status == LYXML_ELEM_CONTENT);
    if (!snode) {
        /* opaque */
        r = lydxml_subtree_opaq(lydctx, parent ? lyd_child(parent) : *first_p, prefix, prefix_len, name, name_len,
                &insert_anchor, &node);
    } else if (snode->nodetype & LYD_NODE_TERM) {
        /* term */
        r = lydxml_subtree_term(lydctx, parent, snode, &node);
    } else if (snode->nodetype & LYD_NODE_INNER) {
        /* inner */
        r = lydxml_subtree_inner(lydctx, snode, ext, &node);
    } else {
        /* any */
        assert(snode->nodetype & LYD_NODE_ANY);
        r = lydxml_subtree_any(lydctx, snode, ext, &node);
    }
    LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

node_parsed:
    if (node && snode) {
        /* add/correct flags */
        r = lyd_parser_set_data_flags(node, &meta, (struct lyd_ctx *)lydctx, ext);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);

        if (!(lydctx->parse_opts & LYD_PARSE_ONLY)) {
            /* store for ext instance node validation, if needed */
            r = lyd_validate_node_ext(node, &lydctx->ext_node);
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
        }
    }

    /* parser next */
    assert(xmlctx->status == LYXML_ELEM_CLOSE);
    if (!parse_subtree) {
        r = lyxml_ctx_next(xmlctx);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
    }

    LY_CHECK_GOTO(!node, cleanup);

    /* add metadata/attributes */
    if (snode) {
        lyd_insert_meta(node, meta, 0);
        meta = NULL;
    } else {
        lyd_insert_attr(node, attr);
        attr = NULL;
    }

    /* insert, keep first pointer correct */
    if (insert_anchor) {
        lyd_insert_after(insert_anchor, node);
    } else if (ext) {
        r = lyplg_ext_insert(parent, node);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
    } else {
        lyd_insert_node(parent, first_p, node,
                lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT);
    }
    while (!parent && (*first_p)->prev->next) {
        *first_p = (*first_p)->prev;
    }

    /* rememeber a successfully parsed node */
    if (parsed) {
        ly_set_add(parsed, node, 1, NULL);
    }

cleanup:
    lydctx->parse_opts = orig_parse_opts;
    lyd_free_meta_siblings(meta);
    lyd_free_attr_siblings(ctx, attr);
    return rc;
}